

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O3

int si9ma::BinaryTree::get_left_most_layer(TreeNode *head)

{
  int iVar1;
  
  iVar1 = 0;
  for (; head != (TreeNode *)0x0; head = head->left) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int BinaryTree::get_left_most_layer(const si9ma::TreeNode *head) {
        if (head == nullptr)
            return 0;

        int count = 0;
        while (head != nullptr){
            count ++;
            head = head->left;
        }

        return count;
    }